

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::PrintTestPartResultToString(TestPartResult *test_part_result)

{
  Type type;
  Message *this;
  Message *this_00;
  size_t extraout_RDX;
  TestPartResult *in_RSI;
  Message *in_RDI;
  String SVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  string local_38 [28];
  int in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  
  Message::Message(in_RDI);
  TestPartResult::file_name((TestPartResult *)0x251e5e);
  TestPartResult::line_number(in_RSI);
  internal::FormatFileLocation_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  Message::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Message::operator<<(in_stack_ffffffffffffff70,(char (*) [2])in_stack_ffffffffffffff68);
  type = TestPartResult::type(in_RSI);
  this = (Message *)TestPartResultTypeToString(type);
  this_00 = Message::operator<<(this,(char **)in_stack_ffffffffffffff68);
  TestPartResult::message((TestPartResult *)0x251f06);
  Message::operator<<(this,(char **)this_00);
  Message::GetString(this_00);
  std::__cxx11::string::~string(local_38);
  Message::~Message((Message *)0x251f49);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)in_RDI;
  return SVar1;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}